

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O2

void __thiscall
CPartialMerkleTree::TraverseAndBuild
          (CPartialMerkleTree *this,int height,uint pos,
          vector<uint256,_std::allocator<uint256>_> *vTxid,
          vector<bool,_std::allocator<bool>_> *vMatch)

{
  const_reference cVar1;
  bool __x;
  ulong __n;
  long in_FS_OFFSET;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    __x = false;
    for (__n = (ulong)(pos << ((byte)height & 0x1f));
        (__n < pos + 1 << ((byte)height & 0x1f) && (__n < this->nTransactions)); __n = __n + 1) {
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](vMatch,__n);
      __x = (bool)(__x | cVar1);
    }
    ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)&this->vBits,__x);
    if ((height != 0 & __x) == 0) break;
    height = height + -1;
    TraverseAndBuild(this,height,pos * 2,vTxid,vMatch);
    pos = pos * 2 + 1;
    if (~(-1 << ((byte)height & 0x1f)) + this->nTransactions >> ((byte)height & 0x1f) <= pos) {
LAB_002ddad6:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  }
  CalcHash(&local_58,this,height,pos,vTxid);
  std::vector<uint256,_std::allocator<uint256>_>::emplace_back<uint256>(&this->vHash,&local_58);
  goto LAB_002ddad6;
}

Assistant:

void CPartialMerkleTree::TraverseAndBuild(int height, unsigned int pos, const std::vector<uint256> &vTxid, const std::vector<bool> &vMatch) {
    // determine whether this node is the parent of at least one matched txid
    bool fParentOfMatch = false;
    for (unsigned int p = pos << height; p < (pos+1) << height && p < nTransactions; p++)
        fParentOfMatch |= vMatch[p];
    // store as flag bit
    vBits.push_back(fParentOfMatch);
    if (height==0 || !fParentOfMatch) {
        // if at height 0, or nothing interesting below, store hash and stop
        vHash.push_back(CalcHash(height, pos, vTxid));
    } else {
        // otherwise, don't store any hash, but descend into the subtrees
        TraverseAndBuild(height-1, pos*2, vTxid, vMatch);
        if (pos*2+1 < CalcTreeWidth(height-1))
            TraverseAndBuild(height-1, pos*2+1, vTxid, vMatch);
    }
}